

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O2

void __thiscall PrintICT::visit(PrintICT *this,CALL *node)

{
  ExprNode *pEVar1;
  ExpList *pEVar2;
  
  printIR(this,"CALL");
  this->level = this->level + 1;
  pEVar1 = node->func;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  pEVar2 = node->args;
  if (pEVar2 != (ExpList *)0x0) {
    (*(pEVar2->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[2])(pEVar2,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintICT::visit(CALL *node) {
    printIR("CALL");
    up_level();
    if (node->getFunc() != NULL) node->getFunc()->accept(this);
    if (node->getArgs() != NULL) node->getArgs()->accept(this);
    down_level();
}